

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Own<const_kj::Directory,_std::nullptr_t> __thiscall
kj::anon_unknown_59::InMemoryDirectory::Impl::copyDirectory
          (Impl *this,Directory *other,bool copyFiles)

{
  byte in_CL;
  undefined7 in_register_00000011;
  Directory *extraout_RDX;
  Own<const_kj::Directory,_std::nullptr_t> OVar1;
  undefined1 local_38 [23];
  bool local_21;
  PromiseArena *pPStack_20;
  bool copyFiles_local;
  Directory *other_local;
  Impl *this_local;
  
  pPStack_20 = (PromiseArena *)CONCAT71(in_register_00000011,copyFiles);
  local_21 = (bool)(in_CL & 1);
  other_local = other;
  this_local = this;
  atomicRefcounted<kj::(anonymous_namespace)::InMemoryDirectory,kj::Clock_const&,kj::InMemoryFileFactory_const&,kj::Directory_const&,bool&>
            ((kj *)local_38,(Clock *)(other->super_ReadableDirectory).super_FsNode._vptr_FsNode,
             (InMemoryFileFactory *)other[1].super_ReadableDirectory.super_FsNode._vptr_FsNode,
             (Directory *)pPStack_20,&local_21);
  Own<kj::Directory_const,decltype(nullptr)>::Own<kj::(anonymous_namespace)::InMemoryDirectory,void>
            ((Own<kj::Directory_const,decltype(nullptr)> *)this,
             (Own<kj::(anonymous_namespace)::InMemoryDirectory,_std::nullptr_t> *)local_38);
  Own<kj::(anonymous_namespace)::InMemoryDirectory,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::InMemoryDirectory,_std::nullptr_t> *)local_38);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<const Directory> copyDirectory(const Directory& other, bool copyFiles) const {
      // Creates an in-memory deep copy of the given directory object. If `copyFiles` is true, then
      // file contents are copied too, otherwise they are just linked.
      return kj::atomicRefcounted<InMemoryDirectory>(clock, fileFactory, other, copyFiles);
    }